

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffdtyp(char *cval,char *dtype,int *status)

{
  byte bVar1;
  char *pcVar2;
  char cVar3;
  
  if (0 < *status) {
    return *status;
  }
  bVar1 = *cval;
  if (bVar1 < 0x28) {
    if (bVar1 == 0) {
      *status = 0xcc;
      return 0xcc;
    }
    cVar3 = 'C';
    if (bVar1 == 0x27) goto LAB_0013f2b6;
  }
  else {
    if (bVar1 == 0x28) {
      cVar3 = 'X';
      goto LAB_0013f2b6;
    }
    if ((bVar1 == 0x46) || (bVar1 == 0x54)) {
      cVar3 = 'L';
      goto LAB_0013f2b6;
    }
  }
  pcVar2 = strchr(cval,0x2e);
  cVar3 = 'F';
  if ((pcVar2 == (char *)0x0) && (pcVar2 = strchr(cval,0x45), pcVar2 == (char *)0x0)) {
    pcVar2 = strchr(cval,0x44);
    cVar3 = (pcVar2 == (char *)0x0) * '\x03' + 'F';
  }
LAB_0013f2b6:
  *dtype = cVar3;
  return *status;
}

Assistant:

int ffdtyp(const char *cval,  /* I - formatted string representation of the value */
           char *dtype, /* O - datatype code: C, L, F, I, or X */
          int *status)  /* IO - error status */
/*
  determine implicit datatype of input string.
  This assumes that the string conforms to the FITS standard
  for keyword values, so may not detect all invalid formats.
*/
{

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);
    else if (cval[0] == '\'')
        *dtype = 'C';          /* character string starts with a quote */
    else if (cval[0] == 'T' || cval[0] == 'F')
        *dtype = 'L';          /* logical = T or F character */
    else if (cval[0] == '(')
        *dtype = 'X';          /* complex datatype "(1.2, -3.4)" */
    else if (strchr(cval,'.'))
        *dtype = 'F';          /* float usualy contains a decimal point */
    else if (strchr(cval,'E') || strchr(cval,'D') )
        *dtype = 'F';          /* exponential contains a E or D */
    else
        *dtype = 'I';          /* if none of the above assume it is integer */

    return(*status);
}